

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

__m256i * convolve(__m256i *s,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i res;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  
  auVar1 = vpmaddwd_avx2(*in_RDI,(undefined1  [32])*in_RSI);
  auVar2 = vpmaddwd_avx2(in_RDI[1],(undefined1  [32])in_RSI[1]);
  auVar3 = vpmaddwd_avx2(in_RDI[2],(undefined1  [32])in_RSI[2]);
  auVar4 = vpmaddwd_avx2(in_RDI[3],(undefined1  [32])in_RSI[3]);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  vpaddd_avx2(auVar1,auVar2);
  return in_RSI;
}

Assistant:

static inline __m128i convolve(const __m128i *const s,
                               const __m128i *const coeffs) {
  const __m128i d0 = _mm_madd_epi16(s[0], coeffs[0]);
  const __m128i d1 = _mm_madd_epi16(s[1], coeffs[1]);
  const __m128i d2 = _mm_madd_epi16(s[2], coeffs[2]);
  const __m128i d3 = _mm_madd_epi16(s[3], coeffs[3]);
  const __m128i d = _mm_add_epi32(_mm_add_epi32(d0, d1), _mm_add_epi32(d2, d3));
  return d;
}